

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary.c
# Opt level: O3

void initFlags(char *problem,char **FLAG,lattice *grid,MPI_Comm Region)

{
  bool bVar1;
  int iVar2;
  char **ppcVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  byte bVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  char acStack_30 [8];
  
  acStack_30[0] = -1;
  acStack_30[1] = 'L';
  acStack_30[2] = '\x10';
  acStack_30[3] = '\0';
  acStack_30[4] = '\0';
  acStack_30[5] = '\0';
  acStack_30[6] = '\0';
  acStack_30[7] = '\0';
  iVar2 = strcmp(problem,"Step");
  if (iVar2 == 0) {
    iVar2 = grid->jmax;
    if (grid->imax < grid->jmax) {
      iVar2 = grid->imax;
    }
    iVar6 = grid->deli;
    if (-2 < iVar6) {
      iVar2 = (iVar2 - (iVar2 + 2 >> 0x1f)) + 2 >> 1;
      lVar5 = 0;
      do {
        if (iVar2 <= grid->il + (int)lVar5) break;
        if (-2 < grid->delj) {
          lVar9 = 0;
          do {
            if (iVar2 <= grid->jb + (int)lVar9) break;
            FLAG[lVar5][lVar9] = '\0';
            bVar1 = lVar9 <= grid->delj;
            lVar9 = lVar9 + 1;
          } while (bVar1);
          iVar6 = grid->deli;
        }
        bVar1 = lVar5 <= iVar6;
        lVar5 = lVar5 + 1;
      } while (bVar1);
    }
  }
  else {
    builtin_strncpy(acStack_30,"\x16M\x10",4);
    acStack_30[4] = '\0';
    acStack_30[5] = '\0';
    acStack_30[6] = '\0';
    acStack_30[7] = '\0';
    iVar2 = strcmp(problem,"Von Karman");
    if ((iVar2 == 0) && (iVar2 = grid->delj, -2 < iVar2)) {
      ppcVar3 = FLAG + 1;
      iVar6 = grid->jmax;
      lVar5 = 0;
      do {
        iVar10 = grid->il + (int)lVar5;
        if (iVar6 / 3 <= iVar10) {
          if ((iVar6 * 2) / 3 <= iVar10) break;
          iVar10 = iVar6 + 7;
          if (-1 < iVar6) {
            iVar10 = iVar6;
          }
          iVar11 = -(iVar10 >> 3);
          iVar10 = iVar6 + 7;
          if (-1 < iVar6) {
            iVar10 = iVar6;
          }
          if (iVar11 <= iVar10 >> 3) {
            lVar9 = (long)iVar11 + -1;
            iVar11 = iVar11 + (int)lVar5;
            do {
              iVar2 = grid->il + grid->jb + iVar11;
              if (iVar6 / 3 <= iVar2) {
                if (((iVar6 * 2) / 3 <= iVar2) || (grid->deli <= iVar2)) break;
                ppcVar3[lVar9 + 1][lVar5 + 1] = '\0';
                iVar6 = grid->jmax;
              }
              iVar2 = iVar6 + 7;
              if (-1 < iVar6) {
                iVar2 = iVar6;
              }
              lVar9 = lVar9 + 1;
              iVar11 = iVar11 + 1;
            } while (lVar9 < iVar2 >> 3);
            iVar2 = grid->delj;
          }
        }
        ppcVar3 = ppcVar3 + 1;
        bVar1 = lVar5 <= iVar2;
        lVar5 = lVar5 + 1;
      } while (bVar1);
    }
  }
  iVar2 = grid->deli;
  if (grid->deli < grid->delj) {
    iVar2 = grid->delj;
  }
  uVar4 = (ulong)(iVar2 + 2) + 0xf & 0xfffffffffffffff0;
  pcVar7 = &stack0xffffffffffffffd8 + -uVar4 + -uVar4;
  pcVar7[-8] = -0x25;
  pcVar7[-7] = 'N';
  pcVar7[-6] = '\x10';
  pcVar7[-5] = '\0';
  pcVar7[-4] = '\0';
  pcVar7[-3] = '\0';
  pcVar7[-2] = '\0';
  pcVar7[-1] = '\0';
  exchangeIntMat(FLAG,&stack0xffffffffffffffd8 + -uVar4,pcVar7,grid,Region);
  iVar2 = grid->deli;
  if (-2 < iVar2) {
    uVar4 = (ulong)(uint)grid->delj;
    lVar5 = 0;
    do {
      if (-2 < (int)uVar4) {
        lVar9 = 0;
        do {
          if (((int)uVar4 < lVar9) || (pcVar7 = FLAG[lVar5], pcVar7[lVar9 + 1] != '\x0f')) {
            if ((lVar9 != 0) && (pcVar7 = FLAG[lVar5], pcVar7[lVar9 + -1] == '\x0f')) {
              bVar8 = 4;
              goto LAB_00104f24;
            }
          }
          else {
            bVar8 = 1;
LAB_00104f24:
            pcVar7[lVar9] = pcVar7[lVar9] | bVar8;
          }
          if (((lVar5 <= grid->deli) && (bVar8 = 2, FLAG[lVar5 + 1][lVar9] == '\x0f')) ||
             ((lVar5 != 0 && (bVar8 = 8, FLAG[lVar5 + -1][lVar9] == '\x0f')))) {
            FLAG[lVar5][lVar9] = FLAG[lVar5][lVar9] | bVar8;
          }
          uVar4 = (ulong)grid->delj;
          bVar1 = lVar9 <= (long)uVar4;
          lVar9 = lVar9 + 1;
        } while (bVar1);
        iVar2 = grid->deli;
      }
      bVar1 = lVar5 <= iVar2;
      lVar5 = lVar5 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void initFlags (const char *problem, char **FLAG, lattice *grid, MPI_Comm Region)
{
	/* Manually sets the flag field for arbitrary generalised geometries.
	 * If the flags are read from a file, set problem to "Image"! */
	if (strcmp(problem,"Step") == 0)
	{
		int max = grid->jmax;
		if (grid->imax < max)
			max = grid->imax;
		max = (max+2)/2;
		for (int i = 0; i < grid->deli+2; i++)
		{
			if (i + grid->il >= max)
				break;
			for (int j = 0; j < grid->delj+2; j++)
			{
				if (j + grid->jb >= max)
					break;
				FLAG[i][j] = C_B;
			}
		}
	}
	else if (strcmp(problem,"Von Karman") == 0)
	{
		for (int i = 0; i < grid->delj+2; i++)
		{
			if (i + grid->il < grid->jmax/3)
				continue;
			if (i + grid->il >= 2*grid->jmax/3)
				break;
			for (int j = -(grid->jmax/4)/2; j <= (grid->jmax/4)/2; j++)
			{
				int x = i+j+grid->il+grid->jb;
				if (x < grid->jmax/3)
					continue;
				if (x >= 2*grid->jmax/3 || x >= grid->deli)
					break;
				FLAG[i+j+1][i+1] = C_B;
			}
		}
	}
	int size = grid->deli+2;
	if (grid->delj+2 > size)
		size = grid->delj+2;
	char buf1[size], buf2[size];
	exchangeIntMat(FLAG,buf1,buf2,grid,Region);
	for (int i = 0; i < grid->deli+2; i++)
	{
		for (int j = 0; j < grid->delj+2; j++)
		{
			if ((j <= grid->delj) && (FLAG[i][j+1] == C_F))
				FLAG[i][j] |= B_N;
			else if ((j != 0) && (FLAG[i][j-1] == C_F))
				FLAG[i][j] |= B_S;
			if ((i <= grid->deli) && (FLAG[i+1][j] == C_F))
				FLAG[i][j] |= B_O;
			else if ((i != 0) && (FLAG[i-1][j] == C_F))
				FLAG[i][j] |= B_W;
		}
	}
	return;
}